

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_CustomOption_Test::
~AllowUnknownDependenciesTest_CustomOption_Test
          (AllowUnknownDependenciesTest_CustomOption_Test *this)

{
  Test *this_00;
  
  this_00 = (Test *)&this[-1].super_AllowUnknownDependenciesTest.db_.files_to_delete_.
                     super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this[-1].super_AllowUnknownDependenciesTest.db_.files_to_delete_.
  super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&PTR__AllowUnknownDependenciesTest_018e20b0;
  (this->super_AllowUnknownDependenciesTest).
  super_TestWithParam<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  .super_Test._vptr_Test = (_func_int **)&DAT_018e20f0;
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&(this->super_AllowUnknownDependenciesTest).db_.files_to_delete_.
                    super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            ((SimpleDescriptorDatabase *)&(this->super_AllowUnknownDependenciesTest).baz_field_);
  testing::Test::~Test(this_00);
  operator_delete(this_00,0xc0);
  return;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, CustomOption) {
  // Test that we can use a custom option without having parsed
  // descriptor.proto.

  FileDescriptorProto option_proto;

  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: \"unknown_custom_options.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { "
      "  extendee: \"google.protobuf.FileOptions\" "
      "  name: \"some_option\" "
      "  number: 123456 "
      "  label: LABEL_OPTIONAL "
      "  type: TYPE_INT32 "
      "} "
      "options { "
      "  uninterpreted_option { "
      "    name { "
      "      name_part: \"some_option\" "
      "      is_extension: true "
      "    } "
      "    positive_int_value: 1234 "
      "  } "
      "  uninterpreted_option { "
      "    name { "
      "      name_part: \"unknown_option\" "
      "      is_extension: true "
      "    } "
      "    positive_int_value: 1234 "
      "  } "
      "  uninterpreted_option { "
      "    name { "
      "      name_part: \"optimize_for\" "
      "      is_extension: false "
      "    } "
      "    identifier_value: \"SPEED\" "
      "  } "
      "}",
      &option_proto));

  const FileDescriptor* file = BuildFile(option_proto);
  ASSERT_TRUE(file != nullptr);

  // Verify that no extension options were set, but they were left as
  // uninterpreted_options.
  std::vector<const FieldDescriptor*> fields;
  file->options().GetReflection()->ListFields(file->options(), &fields);
  ASSERT_EQ(2, fields.size());
  EXPECT_TRUE(file->options().has_optimize_for());
  EXPECT_EQ(2, file->options().uninterpreted_option_size());
}